

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compress_bound.cc
# Opt level: O0

void __thiscall compress_bound_variant::estimate(compress_bound_variant *this,int32_t level)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t dest_len;
  size_t i;
  int32_t j;
  AssertionResult gtest_ar_;
  int err;
  uint8_t dest [128];
  uint8_t *uncompressed;
  size_t estimate_len;
  char (*in_stack_fffffffffffffe28) [9];
  AssertionResult *in_stack_fffffffffffffe30;
  Message *in_stack_fffffffffffffe38;
  Message *in_stack_fffffffffffffe40;
  Message *in_stack_fffffffffffffe48;
  Message *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe58;
  AssertionResult *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 uVar2;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffeb0;
  uchar *in_stack_fffffffffffffeb8;
  size_t *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  AssertionResult local_130;
  undefined8 local_120;
  ulong local_118;
  int local_110;
  uint local_10c;
  string local_108 [71];
  undefined1 local_c1;
  AssertionResult local_c0;
  int32_t local_ac;
  void *local_20;
  size_t local_18;
  
  local_18 = 0;
  local_20 = (void *)0x0;
  local_20 = malloc(0x20);
  local_c1 = local_20 != (void *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,(bool *)in_stack_fffffffffffffe28,(type *)0x119031);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    uVar2 = bVar1;
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe60,
               (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),(char *)in_stack_fffffffffffffe50,
               (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(char *)in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
               (Message *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_108);
    testing::Message::~Message((Message *)0x119112);
  }
  local_10c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1191a0);
  if (local_10c == 0) {
    for (local_110 = 0; local_110 < 0x20; local_110 = local_110 + 1) {
      *(char *)((long)local_20 + (long)local_110) = (char)local_110;
    }
    for (local_118 = 0; local_118 < 0x20; local_118 = local_118 + 1) {
      local_120 = 0x80;
      local_18 = zng_compressBound(local_118);
      local_ac = zng_compress2((uchar *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ),in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8,
                               (size_t)in_stack_fffffffffffffeb0._M_head_impl,
                               in_stack_fffffffffffffeac);
      in_stack_fffffffffffffecc = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                 (int *)in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::AssertionResult::failure_message((AssertionResult *)0x119307);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,
                   (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x119364);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1193b9);
      in_stack_fffffffffffffe60 = (AssertionResult *)&stack0xfffffffffffffea8;
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                ((char *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                 (unsigned_long *)in_stack_fffffffffffffe38,
                 (unsigned_long *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe60);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe58 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,(char (*) [8])in_stack_fffffffffffffe28
                       );
        in_stack_fffffffffffffe50 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe48 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,(char (*) [2])in_stack_fffffffffffffe28
                       );
        in_stack_fffffffffffffe40 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe38 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,
                        (unsigned_long *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe30 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x1194c6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,
                   (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x119514);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x119563);
    }
    free(local_20);
  }
  return;
}

Assistant:

void estimate(int32_t level) {
        z_size_t estimate_len = 0;
        uint8_t *uncompressed = NULL;
        uint8_t dest[128];
        int err;

        uncompressed = (uint8_t *)malloc(MAX_LENGTH);
        ASSERT_TRUE(uncompressed != NULL);

        /* buffer with values for worst case compression */
        for (int32_t j = 0; j < MAX_LENGTH; j++) {
            uncompressed[j] = (uint8_t)j;
        }

        for (z_uintmax_t i = 0; i < MAX_LENGTH; i++) {
            z_uintmax_t dest_len = sizeof(dest);

            /* calculate actual output length */
            estimate_len = PREFIX(compressBound)(i);

            err = PREFIX(compress2)(dest, &dest_len, uncompressed, i, level);
            EXPECT_EQ(err, Z_OK);
            EXPECT_GE(estimate_len, dest_len) <<
                "level: " << level << "\n" <<
                "length: " << i;
        }

        free(uncompressed);
    }